

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_buffer.h
# Opt level: O0

void __thiscall
PenguinV_Image::ImageTemplate<int>::_setType
          (ImageTemplate<int> *this,uint8_t type,AllocateFunction allocateFunction,
          DeallocateFunction deallocateFunction,CopyFunction copyFunction,SetFunction setFunction)

{
  SetFunction in_RDX;
  code in_SIL;
  DeallocateFunction in_RDI;
  AllocateFunction unaff_retaddr;
  undefined7 in_stack_fffffffffffffff0;
  
  in_RDI[0x20] = in_SIL;
  FunctionFacade::instance();
  FunctionFacade::initialize
            ((FunctionFacade *)copyFunction,setFunction._7_1_,unaff_retaddr,in_RDI,
             (CopyFunction)CONCAT17(in_SIL,in_stack_fffffffffffffff0),in_RDX);
  return;
}

Assistant:

void _setType( uint8_t type = 0u, AllocateFunction allocateFunction = _allocateMemory, DeallocateFunction deallocateFunction = _deallocateMemory,
                       CopyFunction copyFunction = _copyMemory, SetFunction setFunction = _setMemory )
        {
            _type = type;
            FunctionFacade::instance().initialize( _type, allocateFunction, deallocateFunction, copyFunction, setFunction );
        }